

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

GenBlock * GenStateFetchBlock(GenBlock *pCurrent,sxi32 iBlockType,sxi32 iCount)

{
  uint uVar1;
  GenBlock *pBlock;
  
  uVar1 = pCurrent->iFlags;
  do {
    if ((uVar1 & 1) != 0) {
      if (iBlockType < 2) {
        return pCurrent;
      }
      iBlockType = iBlockType + -1;
    }
    pCurrent = pCurrent->pParent;
  } while ((pCurrent != (GenBlock *)0x0) && (uVar1 = pCurrent->iFlags, (uVar1 & 10) == 0));
  return (GenBlock *)0x0;
}

Assistant:

static GenBlock * GenStateFetchBlock(GenBlock *pCurrent, sxi32 iBlockType, sxi32 iCount)
{
	GenBlock *pBlock = pCurrent;
	for(;;){
		if( pBlock->iFlags & iBlockType ){
			iCount--; /* Decrement nesting level */
			if( iCount < 1 ){
				/* Block meet with the desired criteria */
				return pBlock;
			}
		}
		/* Point to the upper block */
		pBlock = pBlock->pParent;
		if( pBlock == 0 || (pBlock->iFlags & (GEN_BLOCK_PROTECTED|GEN_BLOCK_FUNC)) ){
			/* Forbidden */
			break;
		}
	}
	/* No such block */
	return 0;
}